

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall
Timer::addTimer(Timer *this,TimerListener *listener,uint32_t msecs,uint32_t private_data)

{
  uint uVar1;
  AutoLock _auto_lock_;
  TimerNode timer;
  AutoLock AStack_68;
  TimerNode local_50;
  
  AutoLock::AutoLock(&AStack_68,&this->mMutex,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                     ,0xf8);
  if (listener != (TimerListener *)0x0) {
    uVar1 = this->mMsPerTick;
    local_50.mEvent.mObj = (Event *)0x0;
    SmartPtr<Event>::operator=(&local_50.mEvent,(Event *)0x0);
    local_50.mDispatcher = (IEventDispatcher *)0x0;
    local_50.mTick = ((msecs + uVar1) - 1) / uVar1 + this->mTicks;
    local_50.mRepeatMS = 0;
    local_50.mRemainingMS = 0;
    local_50.mListener = listener;
    local_50.mPrivateData = private_data;
    addTimerNode(this,&local_50);
    SmartPtr<Event>::~SmartPtr(&local_50.mEvent);
    AutoLock::~AutoLock(&AStack_68);
    return;
  }
  abort();
}

Assistant:

void Timer::addTimer( TimerListener *listener,
					  uint32_t msecs,
					  uint32_t private_data )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	DebugAutoLock( mMutex );

	if (listener == NULL) abort();

	// Calculate the timeout time in ticks
	uint32_t ticks = ( msecs +  mMsPerTick - 1 ) / mMsPerTick;
	
	// Initialize new timer node
	TimerNode timer;
	timer.mEvent = NULL;
	timer.mDispatcher = NULL;
	timer.mPrivateData = private_data;
	timer.mListener = listener;
	timer.mTick = mTicks + ticks;
	timer.mRepeatMS = 0;
	timer.mRemainingMS = 0;	

	LOG( "timer at %d ticks", timer.mTick );

	addTimerNode( timer );
}